

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::Cord::AppendImpl<absl::Cord_const&>(Cord *this,Cord *src)

{
  CordRepBtree **this_00;
  bool bVar1;
  char *pcVar2;
  CordRepFlat *this_01;
  CordRep *pCVar3;
  reference src_00;
  CordRep *rep;
  string_view chunk;
  ChunkIterator __end0;
  ChunkIterator __begin0;
  ChunkRange *__range3;
  Cord local_68;
  string_view local_58;
  string_view local_48;
  CordRep *local_38;
  CordRep *src_tree;
  size_t src_size;
  CordRep *rep_1;
  Cord *pCStack_18;
  MethodIdentifier method;
  Cord *src_local;
  Cord *this_local;
  
  rep_1._4_4_ = 1;
  pCStack_18 = src;
  src_local = this;
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar1 = empty(pCStack_18);
  if (!bVar1) {
    bVar1 = empty(this);
    if (bVar1) {
      bVar1 = InlineRep::is_tree(&pCStack_18->contents_);
      if (bVar1) {
        pCVar3 = TakeRep(pCStack_18);
        src_size = (size_t)cord_internal::RemoveCrcNode(pCVar3);
        InlineRep::EmplaceTree(&this->contents_,(CordRep *)src_size,kAppendCord);
      }
      else {
        cord_internal::InlineData::operator=((InlineData *)this,(InlineData *)pCStack_18);
      }
    }
    else {
      src_tree = (CordRep *)InlineRep::size(&pCStack_18->contents_);
      if (src_tree < (CordRep *)0x200) {
        local_38 = InlineRep::tree(&pCStack_18->contents_);
        if (local_38 == (CordRep *)0x0) {
          pcVar2 = InlineRep::data(&pCStack_18->contents_);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_48,pcVar2,(size_type)src_tree);
          InlineRep::AppendArray(&this->contents_,local_48,kAppendCord);
        }
        else {
          bVar1 = cord_internal::CordRep::IsFlat(local_38);
          if (bVar1) {
            this_01 = cord_internal::CordRep::flat(local_38);
            pcVar2 = cord_internal::CordRepFlat::Data(this_01);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_58,pcVar2,(size_type)src_tree);
            InlineRep::AppendArray(&this->contents_,local_58,kAppendCord);
          }
          else if (pCStack_18 == this) {
            Cord(&local_68,pCStack_18);
            Append(this,&local_68);
            ~Cord(&local_68);
          }
          else {
            __begin0.btree_reader_.navigator_.node_[0xb] = (CordRepBtree *)Chunks(pCStack_18);
            this_00 = __begin0.btree_reader_.navigator_.node_ + 0xb;
            ChunkRange::begin((ChunkIterator *)(__end0.btree_reader_.navigator_.node_ + 0xb),
                              (ChunkRange *)this_00);
            ChunkRange::end((ChunkIterator *)&chunk._M_str,(ChunkRange *)this_00);
            while (bVar1 = ChunkIterator::operator!=
                                     ((ChunkIterator *)(__end0.btree_reader_.navigator_.node_ + 0xb)
                                      ,(ChunkIterator *)&chunk._M_str), bVar1) {
              src_00 = ChunkIterator::operator*
                                 ((ChunkIterator *)(__end0.btree_reader_.navigator_.node_ + 0xb));
              Append(this,src_00);
              ChunkIterator::operator++
                        ((ChunkIterator *)(__end0.btree_reader_.navigator_.node_ + 0xb));
            }
          }
        }
      }
      else {
        pCVar3 = TakeRep(pCStack_18);
        pCVar3 = cord_internal::RemoveCrcNode(pCVar3);
        InlineRep::AppendTree(&this->contents_,pCVar3,kAppendCord);
      }
    }
  }
  return;
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}